

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  SASL_MECHANISM_HANDLE sasl_mechanism;
  IO_INTERFACE_DESCRIPTION *pIVar2;
  XIO_HANDLE xio;
  XIO_HANDLE xio_00;
  CONNECTION_HANDLE connection;
  SESSION_HANDLE session;
  AMQP_VALUE source;
  AMQP_VALUE target;
  LINK_HANDLE link;
  MESSAGE_HANDLE message;
  MESSAGE_SENDER_HANDLE message_sender;
  TICK_COUNTER_HANDLE tick_counter;
  int iVar3;
  BINARY_DATA amqp_data;
  tickcounter_ms_t end_time;
  tickcounter_ms_t start_time;
  uchar hello [5];
  SASLCLIENTIO_CONFIG sasl_io_config;
  SASL_PLAIN_CONFIG sasl_plain_config;
  TLSIO_CONFIG tls_io_config;
  tickcounter_ms_t local_a0;
  tickcounter_ms_t local_98;
  uchar local_90 [8];
  XIO_HANDLE local_88;
  SASL_MECHANISM_HANDLE local_80;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  iVar1 = platform_init();
  iVar3 = -1;
  if (iVar1 == 0) {
    local_68 = 0;
    local_78 = "<<<Replace with your own key name>>>";
    pcStack_70 = "<<<Replace with your own key>>>";
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = "<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>";
    uStack_50 = 0x1627;
    builtin_memcpy(local_90,"Hello",5);
    sasl_mechanism_interface_description = saslplain_get_interface();
    sasl_mechanism = saslmechanism_create(sasl_mechanism_interface_description,&local_78);
    pIVar2 = platform_get_default_tlsio();
    xio = xio_create(pIVar2,&local_58);
    local_88 = xio;
    local_80 = sasl_mechanism;
    pIVar2 = saslclientio_get_interface_description();
    xio_00 = xio_create(pIVar2,&local_88);
    connection = connection_create(xio_00,
                                   "<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>"
                                   ,"some",(ON_NEW_ENDPOINT)0x0,(void *)0x0);
    connection_set_trace(connection,true);
    session = session_create(connection,(ON_LINK_ATTACHED)0x0,(void *)0x0);
    session_set_incoming_window(session,0x7fffffff);
    session_set_outgoing_window(session,0x10000);
    source = messaging_create_source("ingress");
    target = messaging_create_target
                       (
                       "amqps://<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>/<<<Replace with your own EH name (like ingress_eh)>>>"
                       );
    link = link_create(session,"sender-link",false,source,target);
    link_set_snd_settle_mode(link,'\0');
    link_set_max_message_size(link,0x10000);
    amqpvalue_destroy(source);
    amqpvalue_destroy(target);
    message = message_create();
    amqp_data.length = 5;
    amqp_data.bytes = local_90;
    message_add_body_amqp_data(message,amqp_data);
    message_sender = messagesender_create(link,(ON_MESSAGE_SENDER_STATE_CHANGED)0x0,(void *)0x0);
    iVar1 = messagesender_open(message_sender);
    if (iVar1 == 0) {
      tick_counter = tickcounter_create();
      iVar1 = tickcounter_get_current_ms(tick_counter,&local_98);
      if (iVar1 == 0) {
        iVar1 = 1000;
        do {
          messagesender_send_async(message_sender,message,on_message_send_complete,message,10000);
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
        message_destroy(message);
        connection_dowork(connection);
        printf("Current memory usage:%lu (max:%lu)\r\n",0xffffffffffffffff,0xffffffffffffffff);
        while (sent_messages != 1000) {
          connection_dowork(connection);
        }
        iVar1 = tickcounter_get_current_ms(tick_counter,&local_a0);
        if (iVar1 == 0) {
          printf("Send %u messages in %lu ms: %.02f msgs/sec\r\n",
                 SUB84((double)(1000.0 / ((float)(local_a0 - local_98) / 1000.0)),0),1000);
        }
        else {
          puts("Error getting end time\r");
        }
      }
      else {
        puts("Error getting start time\r");
      }
    }
    else {
      message_destroy(message);
    }
    messagesender_destroy(message_sender);
    link_destroy(link);
    session_destroy(session);
    connection_destroy(connection);
    xio_destroy(xio_00);
    xio_destroy(xio);
    saslmechanism_destroy(sasl_mechanism);
    platform_deinit();
    iVar3 = 0;
    printf("Max memory usage:%lu\r\n",0xffffffffffffffff);
    printf("Current memory usage:%lu\r\n",0xffffffffffffffff);
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    (void)argc;
    (void)argv;

    if (platform_init() != 0)
    {
        result = -1;
    }
    else
    {
        XIO_HANDLE sasl_io;
        CONNECTION_HANDLE connection;
        SESSION_HANDLE session;
        LINK_HANDLE link;
        MESSAGE_SENDER_HANDLE message_sender;
        MESSAGE_HANDLE message;
        SASL_PLAIN_CONFIG sasl_plain_config = { EH_KEY_NAME, EH_KEY, NULL };
        TLSIO_CONFIG tls_io_config = { EH_HOST, 5671 };
        const IO_INTERFACE_DESCRIPTION* tlsio_interface;
        SASLCLIENTIO_CONFIG sasl_io_config;
        AMQP_VALUE source;
        AMQP_VALUE target;

        size_t last_memory_used = 0;
        SASL_MECHANISM_HANDLE sasl_mechanism_handle;
        XIO_HANDLE tls_io;
        unsigned char hello[] = { 'H', 'e', 'l', 'l', 'o' };
        BINARY_DATA binary_data;

        gballoc_init();

        /* create SASL PLAIN handler */
        sasl_mechanism_handle = saslmechanism_create(saslplain_get_interface(), &sasl_plain_config);

        /* create the TLS IO */
        tlsio_interface = platform_get_default_tlsio();
        tls_io = xio_create(tlsio_interface, &tls_io_config);

        /* create the SASL client IO using the TLS IO */
        sasl_io_config.underlying_io = tls_io;
        sasl_io_config.sasl_mechanism = sasl_mechanism_handle;
        sasl_io = xio_create(saslclientio_get_interface_description(), &sasl_io_config);

        /* create the connection, session and link */
        connection = connection_create(sasl_io, EH_HOST, "some", NULL, NULL);
        connection_set_trace(connection, true);
        session = session_create(connection, NULL, NULL);
        session_set_incoming_window(session, 2147483647);
        session_set_outgoing_window(session, 65536);

        source = messaging_create_source("ingress");
        target = messaging_create_target("amqps://" EH_HOST "/" EH_NAME);
        link = link_create(session, "sender-link", role_sender, source, target);
        link_set_snd_settle_mode(link, sender_settle_mode_unsettled);
        (void)link_set_max_message_size(link, 65536);

        amqpvalue_destroy(source);
        amqpvalue_destroy(target);

        message = message_create();

        binary_data.bytes = hello;
        binary_data.length = sizeof(hello);
        message_add_body_amqp_data(message, binary_data);

        /* create a message sender */
        message_sender = messagesender_create(link, NULL, NULL);
        if (messagesender_open(message_sender) == 0)
        {
            uint32_t i;
            bool keep_running = true;
            tickcounter_ms_t start_time;
            TICK_COUNTER_HANDLE tick_counter = tickcounter_create();

            if (tickcounter_get_current_ms(tick_counter, &start_time) != 0)
            {
                (void)printf("Error getting start time\r\n");
            }
            else
            {
                for (i = 0; i < msg_count; i++)
                {
                    /* timeout if it takes longer than 10s */
                    (void)messagesender_send_async(message_sender, message, on_message_send_complete, message, 10000);
                }

                message_destroy(message);

                while (keep_running)
                {
                    size_t current_memory_used;
                    size_t maximum_memory_used;
                    connection_dowork(connection);

                    current_memory_used = gballoc_getCurrentMemoryUsed();
                    maximum_memory_used = gballoc_getMaximumMemoryUsed();

                    if (current_memory_used != last_memory_used)
                    {
                        (void)printf("Current memory usage:%lu (max:%lu)\r\n", (unsigned long)current_memory_used, (unsigned long)maximum_memory_used);
                        last_memory_used = current_memory_used;
                    }

                    if (sent_messages == msg_count)
                    {
                        break;
                    }
                }

                {
                    tickcounter_ms_t end_time;
                    if (tickcounter_get_current_ms(tick_counter, &end_time) != 0)
                    {
                        (void)printf("Error getting end time\r\n");
                    }
                    else
                    {
                        (void)printf("Send %u messages in %lu ms: %.02f msgs/sec\r\n", (unsigned int)msg_count, (unsigned long)(end_time - start_time), (float)msg_count / ((float)(end_time - start_time) / 1000));
                    }
                }
            }
        }
        else
        {
            message_destroy(message);
        }

        messagesender_destroy(message_sender);
        link_destroy(link);
        session_destroy(session);
        connection_destroy(connection);
        xio_destroy(sasl_io);
        xio_destroy(tls_io);
        saslmechanism_destroy(sasl_mechanism_handle);
        platform_deinit();

        (void)printf("Max memory usage:%lu\r\n", (unsigned long)gballoc_getCurrentMemoryUsed());
        (void)printf("Current memory usage:%lu\r\n", (unsigned long)gballoc_getMaximumMemoryUsed());

        gballoc_deinit();

        result = 0;
    }

    return result;
}